

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::RaiseScope(cmMakefile *this,string *var,char *varDef)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  cmVariableWatch *this_00;
  cmVariableWatch *vv;
  ostringstream local_198 [8];
  ostringstream m;
  char *varDef_local;
  string *var_local;
  cmMakefile *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = cmStateSnapshot::RaiseScope(&this->StateSnapshot,var,varDef);
    if (bVar1) {
      this_00 = GetVariableWatch(this);
      if (this_00 != (cmVariableWatch *)0x0) {
        cmVariableWatch::VariableAccessed(this_00,var,3,varDef,this);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar3 = std::operator<<((ostream *)local_198,"Cannot set \"");
      poVar3 = std::operator<<(poVar3,(string *)var);
      std::operator<<(poVar3,"\": current scope has no parent.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,(string *)&vv);
      std::__cxx11::string::~string((string *)&vv);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
  }
  return;
}

Assistant:

void cmMakefile::RaiseScope(const std::string& var, const char* varDef)
{
  if (var.empty()) {
    return;
  }

  if (!this->StateSnapshot.RaiseScope(var, varDef)) {
    std::ostringstream m;
    m << "Cannot set \"" << var << "\": current scope has no parent.";
    this->IssueMessage(MessageType::AUTHOR_WARNING, m.str());
    return;
  }

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(var, cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         varDef, this);
  }
#endif
}